

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O2

void run_threads(uint n_threads,os_thread_t *threads,context *ctx)

{
  ulong uVar1;
  ulong uVar2;
  os_thread_t *thread;
  bool bVar3;
  
  uVar1 = (ulong)n_threads;
  uVar2 = uVar1;
  thread = threads;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    os_thread_create(thread,(os_thread_attr_t *)0x0,ctx->worker,ctx);
    thread = thread + 1;
    ctx = ctx + 1;
  }
  while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
    os_thread_join(threads,(void **)0x0);
    threads = threads + 1;
  }
  return;
}

Assistant:

static void
run_threads(unsigned n_threads, os_thread_t *threads, struct context *ctx)
{
	for (unsigned i = 0; i < n_threads; ++i)
		os_thread_create(&threads[i], NULL, ctx[i].worker,
					&ctx[i]);

	for (unsigned i = 0; i < n_threads; ++i)
		os_thread_join(&threads[i], NULL);
}